

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::weibull_dist<double>::operator()(weibull_dist<double> *this,lcg64_shift *r)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  
  dVar1 = (this->P).theta_;
  uVar2 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar2;
  uVar2 = uVar2 >> 0x11 ^ uVar2;
  uVar2 = uVar2 << 0x1f ^ uVar2;
  dVar3 = log((double)(uVar2 >> 1 ^ uVar2 >> 9) * -1.0842021724855042e-19 + 1.0);
  dVar3 = pow(-dVar3,1.0 / (this->P).beta_);
  return dVar3 * dVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.theta() * math::pow(-math::ln(utility::uniformoc<result_type>(r)), 1 / P.beta());
    }